

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZQuadTorus.h
# Opt level: O0

void __thiscall
pzgeom::TPZQuadTorus::TPZQuadTorus(TPZQuadTorus *this,TPZQuadTorus *cp,TPZGeoMesh *param_3)

{
  long in_RSI;
  TPZFNMatrix<12,_double> *in_RDI;
  TPZFNMatrix<12,_double> *unaff_retaddr;
  TPZGeoQuad *in_stack_ffffffffffffffd0;
  void **in_stack_ffffffffffffffd8;
  TPZGeoQuad *in_stack_ffffffffffffffe0;
  TPZFNMatrix<12,_double> *copy;
  
  copy = in_RDI;
  TPZGeoQuad::TPZGeoQuad
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  (in_RDI->super_TPZFMatrix<double>).super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable.
  _vptr_TPZSavable = (_func_int **)&PTR__TPZQuadTorus_0245e2b0;
  (in_RDI->super_TPZFMatrix<double>).fGiven = *(double **)(in_RSI + 0x28);
  (in_RDI->super_TPZFMatrix<double>).fSize = *(int64_t *)(in_RSI + 0x30);
  TPZManVector<double,_10>::TPZManVector
            ((TPZManVector<double,_10> *)unaff_retaddr,(TPZManVector<double,_10> *)copy);
  TPZFNMatrix<12,_double>::TPZFNMatrix(unaff_retaddr,copy);
  return;
}

Assistant:

TPZQuadTorus(const TPZQuadTorus &cp, TPZGeoMesh &) : TPZGeoQuad(cp), fR(cp.fR), fr(cp.fr), fOrigin(cp.fOrigin), fPhiTheta(cp.fPhiTheta)
		{
		}